

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O3

void Gia_ManCheckUnateTest(Gia_Man_t *p,int fComputeAll,int fVerbose)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  uint iCoId;
  uint uVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  int level;
  uint uVar7;
  timespec ts;
  int local_5c;
  long local_48;
  timespec local_40;
  
  if (fComputeAll != 0) {
    Gia_ManCheckUnateVecTest(p,fVerbose);
    return;
  }
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    local_48 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  uVar1 = p->vCis->nSize;
  __ptr = calloc((long)(int)uVar1 + 1,1);
  if (fVerbose != 0) {
    printf("Inputs  : ");
    if (0 < (int)uVar1) {
      uVar5 = 0;
      uVar4 = uVar1;
      do {
        printf("%d",(ulong)(uint)((int)uVar5 + (int)(uVar5 / 10) * -10));
        uVar5 = (ulong)((int)uVar5 + 1);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    putchar(10);
  }
  pVVar6 = p->vCos;
  uVar4 = pVVar6->nSize;
  if ((int)uVar4 < 1) {
    uVar7 = 0;
    local_5c = 0;
  }
  else {
    local_5c = 0;
    uVar7 = 0;
    iCoId = 0;
    do {
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          iVar2 = Gia_ManCheckUnate(p,(int)uVar5,iCoId);
          switch(iVar2) {
          case 0:
            *(undefined1 *)((long)__ptr + uVar5) = 0x2e;
            local_5c = local_5c + 1;
            break;
          case 1:
            *(undefined1 *)((long)__ptr + uVar5) = 0x6e;
            goto LAB_007e9bd1;
          case 2:
            *(undefined1 *)((long)__ptr + uVar5) = 0x70;
LAB_007e9bd1:
            uVar7 = uVar7 + 1;
            break;
          case 3:
            *(undefined1 *)((long)__ptr + uVar5) = 0x20;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUnate.c"
                          ,0xec,"void Gia_ManCheckUnateTest(Gia_Man_t *, int, int)");
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      if (fVerbose != 0) {
        printf("Out%4d : %s\n",(ulong)iCoId,__ptr);
      }
      iCoId = iCoId + 1;
      pVVar6 = p->vCos;
      uVar4 = pVVar6->nSize;
    } while ((int)iCoId < (int)uVar4);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
    uVar4 = pVVar6->nSize;
  }
  iVar2 = 0x9a3c8a;
  printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",(ulong)(uint)p->vCis->nSize,
         (ulong)uVar4,(ulong)(local_5c + uVar7),(ulong)uVar7);
  Abc_Print(iVar2,"%s =","Total time");
  level = 3;
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + local_48) / 1000000.0);
  return;
}

Assistant:

void Gia_ManCheckUnateTest( Gia_Man_t * p, int fComputeAll, int fVerbose )
{
    if ( fComputeAll )
        Gia_ManCheckUnateVecTest( p, fVerbose );
    else
    {
        abctime clk = Abc_Clock();
        int i, o, nVars = Gia_ManCiNum(p);
        int nUnate = 0, nNonUnate = 0;
        char * pBuffer = ABC_CALLOC( char, nVars+1 );
        if ( fVerbose )
        {
            printf( "Inputs  : " );
            for ( i = 0; i < nVars; i++ )
                printf( "%d", i % 10 );
            printf( "\n" );
        }
        for ( o = 0; o < Gia_ManCoNum(p); o++ )
        {
            for ( i = 0; i < nVars; i++ )
            {
                int Res = Gia_ManCheckUnate( p, i, o );
                if ( Res == 3 )       pBuffer[i] = ' ';
                else if ( Res == 2 )  pBuffer[i] = 'p', nUnate++;
                else if ( Res == 1 )  pBuffer[i] = 'n', nUnate++;
                else if ( Res == 0 )  pBuffer[i] = '.', nNonUnate++;
                else assert( 0 );
            }
            if ( fVerbose )
                printf( "Out%4d : %s\n", o, pBuffer );
        }
        ABC_FREE( pBuffer );
        // print stats
        printf( "Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
            Gia_ManCiNum(p), Gia_ManCoNum(p), nUnate+nNonUnate, nUnate );
        ABC_PRT( "Total time", Abc_Clock() - clk );
    }
}